

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

QueueJob * __thiscall
anon_unknown.dwarf_1e75e5::PriorityQueueScheduler::getNextJob
          (QueueJob *__return_storage_ptr__,PriorityQueueScheduler *this)

{
  llbuild::basic::QueueJob::QueueJob
            (__return_storage_ptr__,
             (this->jobs).c.
             super__Vector_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  priority_queue<llbuild::basic::QueueJob,_std::vector<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>,_QueueJobLess>
  ::pop(&this->jobs);
  return __return_storage_ptr__;
}

Assistant:

QueueJob getNextJob() override {
    QueueJob job = jobs.top();
    jobs.pop();
    return job;
  }